

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialize_model<ExtIsoForest,char_const*>
               (ExtIsoForest *model,char **in,bool has_same_endianness,bool has_same_int_size,
               bool has_same_size_t_size,PlatformSize saved_int_t,PlatformSize saved_size_t,
               bool lacks_range_penalty,bool lacks_scoring_metric)

{
  runtime_error *this;
  bool diff_endian;
  PlatformSize PVar1;
  allocator<char> local_15c;
  allocator<char> local_15b;
  allocator<char> local_15a;
  allocator<char> local_159;
  vector<char,_std::allocator<char>_> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  diff_endian = !has_same_endianness;
  if (((~(has_same_int_size && has_same_size_t_size) | diff_endian | lacks_range_penalty |
       lacks_scoring_metric) & 1U) == 0) {
    deserialize_model<char_const*>(model,in);
    return;
  }
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  PVar1 = saved_size_t ^ Is32Bit;
  if ((saved_int_t ^ Is16Bit) == 0 && PVar1 == 0) {
    deserialize_model<char_const*,short,unsigned_int>
              (model,in,&buffer,diff_endian,lacks_range_penalty,lacks_scoring_metric);
  }
  else if ((saved_int_t ^ Is32Bit) == 0 && PVar1 == 0) {
    deserialize_model<char_const*,int,unsigned_int>
              (model,in,&buffer,diff_endian,lacks_range_penalty,lacks_scoring_metric);
  }
  else if (saved_int_t == Is64Bit && PVar1 == 0) {
    deserialize_model<char_const*,long,unsigned_int>
              (model,in,&buffer,diff_endian,lacks_range_penalty,lacks_scoring_metric);
  }
  else {
    if ((saved_int_t ^ Is16Bit) != 0 || (saved_size_t ^ Is64Bit) != 0) {
      if ((saved_int_t ^ Is32Bit) == 0 && (saved_size_t ^ Is64Bit) == 0) {
        deserialize_model<char_const*,int,unsigned_long>
                  (model,in,&buffer,diff_endian,lacks_range_penalty,lacks_scoring_metric);
        goto LAB_0030f036;
      }
      if ((saved_int_t != Is64Bit) || (saved_size_t != Is64Bit)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Unexpected error in ",&local_159);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/serialize.cpp"
                   ,&local_15a);
        std::operator+(&local_98,&local_b8,&local_d8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,":",&local_15b);
        std::operator+(&local_78,&local_98,&local_f8);
        std::__cxx11::to_string(&local_118,0xff9);
        std::operator+(&local_58,&local_78,&local_118);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,
                   ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                   ,&local_15c);
        std::operator+(&local_38,&local_58,&local_138);
        std::runtime_error::runtime_error(this,(string *)&local_38);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    deserialize_model<char_const*,short,unsigned_long>
              (model,in,&buffer,diff_endian,lacks_range_penalty,lacks_scoring_metric);
  }
LAB_0030f036:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void deserialize_model
(
    Model &model,
    itype &in,
    const bool has_same_endianness,
    const bool has_same_int_size,
    const bool has_same_size_t_size,
    const PlatformSize saved_int_t,
    const PlatformSize saved_size_t,
    const bool lacks_range_penalty,
    const bool lacks_scoring_metric
)
{
    if (has_same_endianness && has_same_int_size && has_same_size_t_size && !lacks_range_penalty && !lacks_scoring_metric)
    {
        deserialize_model(model, in);
        return;
    }

    std::vector<char> buffer;

    if (saved_int_t == Is16Bit && saved_size_t == Is32Bit)
    {
        deserialize_model<itype, int16_t, uint32_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is32Bit && saved_size_t == Is32Bit)
    {
        deserialize_model<itype, int32_t, uint32_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is64Bit && saved_size_t == Is32Bit)
    {
        deserialize_model<itype, int64_t, uint32_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is16Bit && saved_size_t == Is64Bit)
    {
        deserialize_model<itype, int16_t, uint64_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is32Bit && saved_size_t == Is64Bit)
    {
        deserialize_model<itype, int32_t, uint64_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else if (saved_int_t == Is64Bit && saved_size_t == Is64Bit)
    {
        deserialize_model<itype, int16_t, uint64_t>(model, in, buffer, !has_same_endianness, lacks_range_penalty, lacks_scoring_metric);
    }

    else
    {
        unexpected_error();
    }
}